

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::WithinUlpsMatcher
          (WithinUlpsMatcher *this,double target,uint64_t ulps,FloatingPointKind baseType)

{
  ulong uVar1;
  uint uVar2;
  ReusableStringStream *this_00;
  ReusableStringStream local_60;
  string local_48;
  FloatingPointKind local_21;
  uint64_t uStack_20;
  FloatingPointKind baseType_local;
  uint64_t ulps_local;
  double target_local;
  WithinUlpsMatcher *this_local;
  
  local_21 = baseType;
  uStack_20 = ulps;
  ulps_local = (uint64_t)target;
  target_local = (double)this;
  Impl::MatcherBase<double>::MatcherBase(&this->super_MatcherBase<double>);
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinUlpsMatcher_002bbeb8;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_002bbee8;
  this->m_target = (double)ulps_local;
  this->m_ulps = uStack_20;
  this->m_type = local_21;
  if (this->m_type != Double) {
    uVar1 = this->m_ulps;
    uVar2 = clara::std::numeric_limits<unsigned_int>::max();
    if (uVar2 <= uVar1) {
      ReusableStringStream::ReusableStringStream(&local_60);
      this_00 = ReusableStringStream::operator<<
                          (&local_60,
                           (char (*) [57])"Provided ULP is impossibly large for a float comparison."
                          );
      ReusableStringStream::str_abi_cxx11_(&local_48,this_00);
      throw_domain_error(&local_48);
    }
  }
  return;
}

Assistant:

WithinUlpsMatcher::WithinUlpsMatcher(double target, uint64_t ulps, FloatingPointKind baseType)
        :m_target{ target }, m_ulps{ ulps }, m_type{ baseType } {
        CATCH_ENFORCE(m_type == FloatingPointKind::Double
                   || m_ulps < (std::numeric_limits<uint32_t>::max)(),
            "Provided ULP is impossibly large for a float comparison.");
    }